

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa_asn1.cc
# Opt level: O3

int rsa_pub_encode(CBB *out,EVP_PKEY *key)

{
  RSA *rsa;
  int iVar1;
  CBB key_bitstring;
  CBB algorithm;
  CBB spki;
  CBB null;
  CBB local_d0;
  CBB local_a0;
  CBB local_70;
  CBB local_40;
  
  rsa = (RSA *)key->pkey;
  iVar1 = CBB_add_asn1(out,&local_70,0x20000010);
  if (((((iVar1 != 0) && (iVar1 = CBB_add_asn1(&local_70,&local_a0,0x20000010), iVar1 != 0)) &&
       (iVar1 = CBB_add_asn1_element(&local_a0,6,rsa_asn1_meth.oid,9), iVar1 != 0)) &&
      ((iVar1 = CBB_add_asn1(&local_a0,&local_40,5), iVar1 != 0 &&
       (iVar1 = CBB_add_asn1(&local_70,&local_d0,3), iVar1 != 0)))) &&
     ((iVar1 = CBB_add_u8(&local_d0,'\0'), iVar1 != 0 &&
      ((iVar1 = RSA_marshal_public_key(&local_d0,rsa), iVar1 != 0 &&
       (iVar1 = CBB_flush(out), iVar1 != 0)))))) {
    return 1;
  }
  ERR_put_error(6,0,0x69,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa_asn1.cc"
                ,0x29);
  return 0;
}

Assistant:

static int rsa_pub_encode(CBB *out, const EVP_PKEY *key) {
  // See RFC 3279, section 2.3.1.
  const RSA *rsa = reinterpret_cast<const RSA *>(key->pkey);
  CBB spki, algorithm, null, key_bitstring;
  if (!CBB_add_asn1(out, &spki, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1(&spki, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&algorithm, CBS_ASN1_OBJECT, rsa_asn1_meth.oid,
                            rsa_asn1_meth.oid_len) ||
      !CBB_add_asn1(&algorithm, &null, CBS_ASN1_NULL) ||
      !CBB_add_asn1(&spki, &key_bitstring, CBS_ASN1_BITSTRING) ||
      !CBB_add_u8(&key_bitstring, 0 /* padding */) ||
      !RSA_marshal_public_key(&key_bitstring, rsa) ||  //
      !CBB_flush(out)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_ENCODE_ERROR);
    return 0;
  }

  return 1;
}